

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

int __thiscall Fl_Check_Browser::add(Fl_Check_Browser *this,char *s,int b)

{
  cb_item *pcVar1;
  char *pcVar2;
  cb_item *p;
  int b_local;
  char *s_local;
  Fl_Check_Browser *this_local;
  
  pcVar1 = (cb_item *)malloc(0x20);
  pcVar1->next = (cb_item *)0x0;
  pcVar1->prev = (cb_item *)0x0;
  pcVar1->checked = (char)b;
  pcVar1->selected = '\0';
  pcVar2 = strdup(s);
  pcVar1->text = pcVar2;
  if (b != 0) {
    this->nchecked_ = this->nchecked_ + 1;
  }
  if (this->last == (cb_item *)0x0) {
    this->last = pcVar1;
    this->first = pcVar1;
  }
  else {
    this->last->next = pcVar1;
    pcVar1->prev = this->last;
    this->last = pcVar1;
  }
  this->nitems_ = this->nitems_ + 1;
  return this->nitems_;
}

Assistant:

int Fl_Check_Browser::add(char *s, int b) {
	cb_item *p = (cb_item *)malloc(sizeof(cb_item));
	p->next = 0;
	p->prev = 0;
	p->checked = b;
	p->selected = 0;
	p->text = strdup(s);

	if (b) {
		nchecked_++;
	}

	if (last == 0) {
		first = last = p;
	} else {
		last->next = p;
		p->prev = last;
		last = p;
	}
	nitems_++;

	return (nitems_);
}